

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O2

void __thiscall
cmCTestCVS::WriteXMLDirectory(cmCTestCVS *this,cmXMLWriter *xml,string *path,Directory *dir)

{
  Revision *__x;
  _Base_ptr p_Var1;
  char *__rhs;
  string branchFlag;
  vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> revisions;
  File f;
  string full;
  
  __rhs = "/";
  if (path->_M_string_length == 0) {
    __rhs = "";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&branchFlag,"Directory",(allocator<char> *)&full);
  cmXMLWriter::StartElement(xml,&branchFlag);
  std::__cxx11::string::~string((string *)&branchFlag);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&branchFlag,"Name",(allocator<char> *)&full);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&branchFlag,path);
  std::__cxx11::string::~string((string *)&branchFlag);
  ComputeBranchFlag(&branchFlag,this,path);
  revisions.super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  revisions.super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  revisions.super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __x = &(this->super_cmCTestVC).Unknown;
  for (p_Var1 = (dir->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus>_>_>
                )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 !=
      &(dir->
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus>_>_>
       )._M_t._M_impl.super__Rb_tree_header; p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,path,
                   __rhs);
    std::operator+(&full,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1)
                  );
    std::__cxx11::string::~string((string *)&f);
    std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::clear(&revisions);
    if (p_Var1[2]._M_color != _S_red) {
      std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::push_back
                (&revisions,__x);
    }
    LoadRevisions(this,&full,branchFlag._M_dataplus._M_p,&revisions);
    std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::resize(&revisions,2,__x)
    ;
    f.Status = p_Var1[2]._M_color;
    f.Rev = revisions.super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>.
            _M_impl.super__Vector_impl_data._M_start;
    f.PriorRev = revisions.
                 super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1;
    cmCTestVC::WriteXMLEntry(&this->super_cmCTestVC,xml,path,(string *)(p_Var1 + 1),&full,&f);
    std::__cxx11::string::~string((string *)&full);
  }
  cmXMLWriter::EndElement(xml);
  std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::~vector(&revisions);
  std::__cxx11::string::~string((string *)&branchFlag);
  return;
}

Assistant:

void cmCTestCVS::WriteXMLDirectory(cmXMLWriter& xml, std::string const& path,
                                   Directory const& dir)
{
  const char* slash = path.empty() ? "" : "/";
  xml.StartElement("Directory");
  xml.Element("Name", path);

  // Lookup the branch checked out in the working tree.
  std::string branchFlag = this->ComputeBranchFlag(path);

  // Load revisions and write an entry for each file in this directory.
  std::vector<Revision> revisions;
  for (auto const& fi : dir) {
    std::string full = path + slash + fi.first;

    // Load two real or unknown revisions.
    revisions.clear();
    if (fi.second != PathUpdated) {
      // For local modifications the current rev is unknown and the
      // prior rev is the latest from cvs.
      revisions.push_back(this->Unknown);
    }
    this->LoadRevisions(full, branchFlag.c_str(), revisions);
    revisions.resize(2, this->Unknown);

    // Write the entry for this file with these revisions.
    File f(fi.second, revisions.data(), revisions.data() + 1);
    this->WriteXMLEntry(xml, path, fi.first, full, f);
  }
  xml.EndElement(); // Directory
}